

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

aphy_error __thiscall
APhyBullet::BulletWorld::removeCharacterController
          (BulletWorld *this,character_controller_ref *character)

{
  iterator __it;
  aphy_error aVar1;
  
  if (character->counter == (Counter *)0x0) {
    aVar1 = APHY_NULL_POINTER;
  }
  else {
    (*(this->handle->super_btCollisionWorld)._vptr_btCollisionWorld[0x11])
              (this->handle,character->counter->object[1].super_base_interface._vptr_base_interface)
    ;
    __it = std::
           _Hashtable<aphy::ref<aphy::character_controller>,_aphy::ref<aphy::character_controller>,_std::allocator<aphy::ref<aphy::character_controller>_>,_std::__detail::_Identity,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::find(&(this->characterControllers)._M_h,character);
    aVar1 = APHY_OK;
    if (__it.super__Node_iterator_base<aphy::ref<aphy::character_controller>,_true>._M_cur !=
        (__node_type *)0x0) {
      std::
      _Hashtable<aphy::ref<aphy::character_controller>,_aphy::ref<aphy::character_controller>,_std::allocator<aphy::ref<aphy::character_controller>_>,_std::__detail::_Identity,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::erase(&(this->characterControllers)._M_h,
              (const_iterator)
              __it.super__Node_iterator_base<aphy::ref<aphy::character_controller>,_true>._M_cur);
    }
  }
  return aVar1;
}

Assistant:

aphy_error BulletWorld::addCharacterController(const character_controller_ref &character)
{
    CHECK_POINTER(character);

    handle->addAction(character.as<BulletCharacterController>()->handle);
    characterControllers.insert(character);
    return APHY_OK;
}